

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

TryGetResult __thiscall capnp::SchemaLoader::Impl::tryGet(Impl *this,uint64_t typeId)

{
  LazyLoadCallback *extraout_RDX;
  LazyLoadCallback *extraout_RDX_00;
  Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> MVar1;
  TryGetResult TVar2;
  RawSchema **schema;
  RawSchema **local_28;
  RawSchema **_schema1789;
  uint64_t typeId_local;
  Impl *this_local;
  
  typeId_local = typeId;
  this_local = this;
  kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
            ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&schema,(unsigned_long *)(typeId + 0x68)
            );
  local_28 = kj::_::readMaybe<capnp::_::RawSchema*const>
                       ((Maybe<capnp::_::RawSchema_*const_&> *)&schema);
  if (local_28 == (RawSchema **)0x0) {
    (this->arena).nextChunkSize = 0;
    InitializerImpl::getCallback((InitializerImpl *)&(this->arena).chunkList);
    MVar1.ptr = extraout_RDX_00;
  }
  else {
    (this->arena).nextChunkSize = (size_t)*local_28;
    InitializerImpl::getCallback((InitializerImpl *)&(this->arena).chunkList);
    MVar1.ptr = extraout_RDX;
  }
  TVar2.callback.ptr = MVar1.ptr;
  TVar2.schema = (RawSchema *)this;
  return TVar2;
}

Assistant:

SchemaLoader::Impl::TryGetResult SchemaLoader::Impl::tryGet(uint64_t typeId) const {
  KJ_IF_SOME(schema, schemas.find(typeId)) {
    return {schema, initializer.getCallback()};
  } else {
    return {nullptr, initializer.getCallback()};
  }
}